

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::PluralRules::getRuleFromResource
          (UnicodeString *__return_storage_ptr__,PluralRules *this,Locale *locale,UPluralType type,
          UErrorCode *errCode)

{
  int32_t iVar1;
  UChar *us;
  UObject UVar2;
  undefined4 uVar3;
  char *inKey;
  int32_t len;
  int32_t resLen;
  LocalUResourceBundlePointer setRes;
  LocalUResourceBundlePointer locRes;
  LocalUResourceBundlePointer rb;
  char *key;
  LocalUResourceBundlePointer ruleRes;
  UnicodeString emptyStr;
  UErrorCode status;
  UnicodeString uKey;
  char setKey [256];
  int32_t local_238;
  int32_t local_234;
  LocalPointerBase<UResourceBundle> local_230;
  LocalPointerBase<UResourceBundle> local_228;
  LocalPointerBase<UResourceBundle> local_220;
  char *local_218;
  LocalUResourceBundlePointer local_210;
  UObject local_208;
  UnicodeString local_1f8;
  UnicodeString local_1b8;
  UnicodeString local_178;
  char local_138 [264];
  
  local_1f8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
  local_1f8.fUnion.fStackFields.fLengthAndFlags = 2;
  if (U_ZERO_ERROR < *errCode) {
    UnicodeString::UnicodeString(__return_storage_ptr__,&local_1f8);
    goto LAB_0026d75d;
  }
  local_220.ptr = ures_openDirect_63((char *)0x0,"plurals",errCode);
  if (*errCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (type == UPLURAL_TYPE_CARDINAL) {
      inKey = "locales";
    }
    else {
      if (type != UPLURAL_TYPE_ORDINAL) {
        *errCode = U_ILLEGAL_ARGUMENT_ERROR;
        goto LAB_0026d487;
      }
      inKey = "locales_ordinals";
    }
    local_228.ptr = ures_getByKey_63(local_220.ptr,inKey,(UResourceBundle *)0x0,errCode);
    if (*errCode < U_ILLEGAL_ARGUMENT_ERROR) {
      local_234 = 0;
      us = ures_getStringByKey_63(local_228.ptr,locale->fullName,&local_234,errCode);
      if (us == (UChar *)0x0) {
        local_1b8.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)((ulong)local_1b8.super_Replaceable.super_UObject._vptr_UObject &
                      0xffffffff00000000);
        strcpy(local_138,locale->fullName);
        while (iVar1 = uloc_getParent_63(local_138,local_138,0x9d,(UErrorCode *)&local_1b8),
              0 < iVar1) {
          local_234 = 0;
          us = ures_getStringByKey_63(local_228.ptr,local_138,&local_234,(UErrorCode *)&local_1b8);
          if (us != (UChar *)0x0) {
            *errCode = U_ZERO_ERROR;
            goto LAB_0026d578;
          }
          local_1b8.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)((ulong)local_1b8.super_Replaceable.super_UObject._vptr_UObject &
                        0xffffffff00000000);
        }
        goto LAB_0026d4ca;
      }
LAB_0026d578:
      u_UCharsToChars_63(us,local_138,local_234 + 1);
      local_210.super_LocalPointerBase<UResourceBundle>.ptr =
           (LocalPointerBase<UResourceBundle>)
           ures_getByKey_63(local_220.ptr,"rules",(UResourceBundle *)0x0,errCode);
      if (*errCode < U_ILLEGAL_ARGUMENT_ERROR) {
        local_230.ptr =
             ures_getByKey_63((UResourceBundle *)
                              local_210.super_LocalPointerBase<UResourceBundle>.ptr,local_138,
                              (UResourceBundle *)0x0,errCode);
        if (*errCode < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar1 = ures_getSize_63(local_230.ptr);
          (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
               (_func_int **)&PTR__UnicodeString_003b2258;
          (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
          local_218 = (char *)0x0;
          if (0 < iVar1) {
            do {
              local_1b8.super_Replaceable.super_UObject._vptr_UObject =
                   (UObject)&PTR__UnicodeString_003b2258;
              local_1b8.fUnion.fStackFields.fLengthAndFlags = 2;
              local_238 = 0;
              UVar2._vptr_UObject =
                   (_func_int **)ures_getNextString_63(local_230.ptr,&local_238,&local_218,errCode);
              if (*errCode < U_ILLEGAL_ARGUMENT_ERROR) {
                local_178.super_Replaceable.super_UObject._vptr_UObject =
                     (UObject)(UObject)UVar2._vptr_UObject;
                UnicodeString::setTo(&local_1b8,'\x01',(ConstChar16Ptr *)&local_178,local_238);
                local_208 = local_178.super_Replaceable.super_UObject._vptr_UObject;
              }
              else {
                UnicodeString::setToBogus(&local_1b8);
              }
              UnicodeString::UnicodeString(&local_178,local_218,-1,kInvariant);
              uVar3 = local_178.fUnion.fFields.fLength;
              if (-1 < local_178.fUnion.fStackFields.fLengthAndFlags) {
                uVar3 = (int)local_178.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              UnicodeString::doAppend(__return_storage_ptr__,&local_178,0,uVar3);
              local_238._0_2_ = L':';
              UnicodeString::doAppend(__return_storage_ptr__,(UChar *)&local_238,0,1);
              uVar3 = local_1b8.fUnion.fFields.fLength;
              if (-1 < local_1b8.fUnion.fStackFields.fLengthAndFlags) {
                uVar3 = (int)local_1b8.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              UnicodeString::doAppend(__return_storage_ptr__,&local_1b8,0,uVar3);
              local_238 = CONCAT22(local_238._2_2_,0x3b);
              UnicodeString::doAppend(__return_storage_ptr__,(UChar *)&local_238,0,1);
              UnicodeString::~UnicodeString(&local_178);
              UnicodeString::~UnicodeString(&local_1b8);
              iVar1 = iVar1 + -1;
            } while (iVar1 != 0);
          }
        }
        else {
          UnicodeString::UnicodeString(__return_storage_ptr__,&local_1f8);
        }
        LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                  ((LocalUResourceBundlePointer *)&local_230);
      }
      else {
        UnicodeString::UnicodeString(__return_storage_ptr__,&local_1f8);
      }
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&local_210);
    }
    else {
LAB_0026d4ca:
      UnicodeString::UnicodeString(__return_storage_ptr__,&local_1f8);
    }
    LocalUResourceBundlePointer::~LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&local_228);
  }
  else {
LAB_0026d487:
    UnicodeString::UnicodeString(__return_storage_ptr__,&local_1f8);
  }
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_220);
LAB_0026d75d:
  UnicodeString::~UnicodeString(&local_1f8);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
PluralRules::getRuleFromResource(const Locale& locale, UPluralType type, UErrorCode& errCode) {
    UnicodeString emptyStr;

    if (U_FAILURE(errCode)) {
        return emptyStr;
    }
    LocalUResourceBundlePointer rb(ures_openDirect(nullptr, "plurals", &errCode));
    if(U_FAILURE(errCode)) {
        return emptyStr;
    }
    const char *typeKey;
    switch (type) {
    case UPLURAL_TYPE_CARDINAL:
        typeKey = "locales";
        break;
    case UPLURAL_TYPE_ORDINAL:
        typeKey = "locales_ordinals";
        break;
    default:
        // Must not occur: The caller should have checked for valid types.
        errCode = U_ILLEGAL_ARGUMENT_ERROR;
        return emptyStr;
    }
    LocalUResourceBundlePointer locRes(ures_getByKey(rb.getAlias(), typeKey, nullptr, &errCode));
    if(U_FAILURE(errCode)) {
        return emptyStr;
    }
    int32_t resLen=0;
    const char *curLocaleName=locale.getName();
    const UChar* s = ures_getStringByKey(locRes.getAlias(), curLocaleName, &resLen, &errCode);

    if (s == nullptr) {
        // Check parent locales.
        UErrorCode status = U_ZERO_ERROR;
        char parentLocaleName[ULOC_FULLNAME_CAPACITY];
        const char *curLocaleName2=locale.getName();
        uprv_strcpy(parentLocaleName, curLocaleName2);

        while (uloc_getParent(parentLocaleName, parentLocaleName,
                                       ULOC_FULLNAME_CAPACITY, &status) > 0) {
            resLen=0;
            s = ures_getStringByKey(locRes.getAlias(), parentLocaleName, &resLen, &status);
            if (s != nullptr) {
                errCode = U_ZERO_ERROR;
                break;
            }
            status = U_ZERO_ERROR;
        }
    }
    if (s==nullptr) {
        return emptyStr;
    }

    char setKey[256];
    u_UCharsToChars(s, setKey, resLen + 1);
    // printf("\n PluralRule: %s\n", setKey);

    LocalUResourceBundlePointer ruleRes(ures_getByKey(rb.getAlias(), "rules", nullptr, &errCode));
    if(U_FAILURE(errCode)) {
        return emptyStr;
    }
    LocalUResourceBundlePointer setRes(ures_getByKey(ruleRes.getAlias(), setKey, nullptr, &errCode));
    if (U_FAILURE(errCode)) {
        return emptyStr;
    }

    int32_t numberKeys = ures_getSize(setRes.getAlias());
    UnicodeString result;
    const char *key=nullptr;
    for(int32_t i=0; i<numberKeys; ++i) {   // Keys are zero, one, few, ...
        UnicodeString rules = ures_getNextUnicodeString(setRes.getAlias(), &key, &errCode);
        UnicodeString uKey(key, -1, US_INV);
        result.append(uKey);
        result.append(COLON);
        result.append(rules);
        result.append(SEMI_COLON);
    }
    return result;
}